

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_interfaces.c
# Opt level: O3

void nhdp_interface_apply_settings(nhdp_interface *interf)

{
  uint64_t first;
  uint64_t uVar1;
  
  _cb_interface_event(&interf->rfc5444_if,false);
  first = interf->overwrite_hello_interval;
  if (first == 0) {
    first = interf->hello_interval;
  }
  uVar1 = interf->overwrite_hello_validity;
  if (uVar1 == 0) {
    uVar1 = interf->validity_time;
  }
  oonf_timer_set_ext(&interf->_hello_timer,first,first);
  interf->refresh_interval = first;
  interf->h_hold_time = uVar1;
  interf->l_hold_time = uVar1;
  interf->n_hold_time = uVar1;
  interf->i_hold_time = uVar1;
  return;
}

Assistant:

void
nhdp_interface_apply_settings(struct nhdp_interface *interf) {
  uint64_t itime, vtime;
  /* parse ip address list again and apply ACL */
  _cb_interface_event(&interf->rfc5444_if, false);

  /* calculate interval and validity time */
  itime = interf->overwrite_hello_interval;
  if (!itime) {
    itime = interf->hello_interval;
  }
  vtime = interf->overwrite_hello_validity;
  if (!vtime) {
    vtime = interf->validity_time;
  }

  /* reset hello generation frequency */
  oonf_timer_set(&interf->_hello_timer, itime);

  interf->refresh_interval = itime;

  /* just copy validity_time for now */
  interf->h_hold_time = vtime;
  interf->l_hold_time = vtime;
  interf->n_hold_time = vtime;
  interf->i_hold_time = vtime;
}